

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall
GEO::PeriodicDelaunay3d::get_periodic_vertex_instances_to_create
          (PeriodicDelaunay3d *this,index_t v,ConvexCell *C,bool *use_instance,
          bool *cell_is_on_boundary,bool *cell_is_outside_cube,IncidentTetrahedra *W)

{
  uint uVar1;
  vec4 eqn;
  vec4 eqn_00;
  undefined1 auVar2 [24];
  vec4 eqn_01;
  vec4 eqn_02;
  vec4 eqn_03;
  vec4 eqn_04;
  vec4 eqn_05;
  vec4 eqn_06;
  vec4 eqn_07;
  vec4 eqn_08;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  index_t i;
  index_t iVar9;
  uint uVar10;
  index_t iVar11;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  int iVar17;
  int dV;
  long lVar18;
  long lVar19;
  index_t lv;
  int (*paiVar20) [3];
  int TX;
  int iVar21;
  int iVar22;
  allocator local_24a;
  allocator local_249;
  int VXLAT [3] [3];
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  double dStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  double dStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  double dStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  double dStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  double dStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined8 local_108;
  double dStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  double dStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  double dStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  double dStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  copy_Laguerre_cell_from_Delaunay(this,v,C,W);
  if (C->first_valid_ == 0x3fff) {
    std::__cxx11::string::string((string *)VXLAT,"!C.empty()",&local_249);
    std::__cxx11::string::string
              ((string *)&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_24a);
    geo_assertion_failed((string *)VXLAT,&local_1d8,0x7b96);
  }
  for (lVar12 = 0; lVar12 != 0x1b; lVar12 = lVar12 + 1) {
    use_instance[lVar12] = false;
  }
  *use_instance = true;
  uVar1 = C->nb_v_;
  local_98 = 0x3ff0000000000000;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  VBW::ConvexCell::clip_by_plane(C,(vec4)ZEXT1632(ZEXT816(0x3ff0000000000000)));
  dStack_a0 = this->period_;
  local_b8 = 0xbff0000000000000;
  uStack_b0 = 0;
  uStack_a8 = 0;
  eqn.z = 0.0;
  eqn.x = -1.0;
  eqn.y = 0.0;
  eqn.w = dStack_a0;
  VBW::ConvexCell::clip_by_plane(C,eqn);
  local_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0x3ff00000;
  local_48 = 0;
  uStack_40 = 0;
  VBW::ConvexCell::clip_by_plane(C,(vec4)(ZEXT832(0x3ff0000000000000) << 0x40));
  dStack_100 = this->period_;
  local_118 = 0;
  uStack_114 = 0;
  uStack_110 = 0;
  uStack_10c = 0xbff00000;
  local_108 = 0;
  auVar2 = ZEXT824(0xbff0000000000000) << 0x40;
  eqn_00.w = dStack_100;
  eqn_00.x = (double)auVar2._0_8_;
  eqn_00.y = (double)auVar2._8_8_;
  eqn_00.z = (double)auVar2._16_8_;
  VBW::ConvexCell::clip_by_plane(C,eqn_00);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x3ff0000000000000;
  uStack_60 = 0;
  eqn_01.z = 1.0;
  eqn_01.x = 0.0;
  eqn_01.y = 0.0;
  eqn_01.w = 0.0;
  VBW::ConvexCell::clip_by_plane(C,eqn_01);
  dStack_120 = this->period_;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0xbff0000000000000;
  eqn_02.z = -1.0;
  eqn_02.x = 0.0;
  eqn_02.y = 0.0;
  eqn_02.w = dStack_120;
  VBW::ConvexCell::clip_by_plane(C,eqn_02);
  *cell_is_outside_cube = false;
  *cell_is_on_boundary = false;
  uVar13 = (ulong)C->first_valid_;
  if (C->first_valid_ == 0x3fff) {
    *cell_is_outside_cube = true;
    copy_Laguerre_cell_from_Delaunay(this,v,C,W);
    dStack_c0 = this->period_;
    local_d8 = 0x3ff0000000000000;
    uStack_d0 = 0;
    uStack_c8 = 0;
    eqn_03.z = 0.0;
    eqn_03.x = 1.0;
    eqn_03.y = 0.0;
    eqn_03.w = dStack_c0;
    VBW::ConvexCell::clip_by_plane(C,eqn_03);
    dStack_e0 = this->period_ + this->period_;
    local_f8 = 0xbff0000000000000;
    uStack_f0 = 0;
    uStack_e8 = 0;
    eqn_04.z = 0.0;
    eqn_04.x = -1.0;
    eqn_04.y = 0.0;
    eqn_04.w = dStack_e0;
    VBW::ConvexCell::clip_by_plane(C,eqn_04);
    dStack_140 = this->period_;
    uStack_150 = 0x3ff0000000000000;
    local_158 = 0;
    local_148 = 0;
    auVar2 = ZEXT824(0x3ff0000000000000) << 0x40;
    eqn_05.w = dStack_140;
    eqn_05.x = (double)auVar2._0_8_;
    eqn_05.y = (double)auVar2._8_8_;
    eqn_05.z = (double)auVar2._16_8_;
    VBW::ConvexCell::clip_by_plane(C,eqn_05);
    dStack_160 = this->period_ + this->period_;
    uStack_170 = 0xbff0000000000000;
    local_178 = 0;
    local_168 = 0;
    auVar2 = ZEXT824(0xbff0000000000000) << 0x40;
    eqn_06.w = dStack_160;
    eqn_06.x = (double)auVar2._0_8_;
    eqn_06.y = (double)auVar2._8_8_;
    eqn_06.z = (double)auVar2._16_8_;
    VBW::ConvexCell::clip_by_plane(C,eqn_06);
    dStack_180 = this->period_;
    local_198 = 0;
    uStack_190 = 0;
    local_188 = 0x3ff0000000000000;
    eqn_07.z = 1.0;
    eqn_07.x = 0.0;
    eqn_07.y = 0.0;
    eqn_07.w = dStack_180;
    VBW::ConvexCell::clip_by_plane(C,eqn_07);
    dStack_1a0 = this->period_ + this->period_;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = 0xbff0000000000000;
    eqn_08.z = -1.0;
    eqn_08.x = 0.0;
    eqn_08.y = 0.0;
    eqn_08.w = dStack_1a0;
    VBW::ConvexCell::clip_by_plane(C,eqn_08);
    if (C->first_valid_ == 0x3fff) {
      std::__cxx11::string::string((string *)VXLAT,"!C.empty()",&local_249);
      std::__cxx11::string::string
                ((string *)&local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,&local_24a);
      geo_assertion_failed((string *)VXLAT,&local_1d8,0x7bc1);
    }
    VXLAT[0][0] = 0;
    VXLAT[0][1] = 0x3ff00000;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = 0;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = 0;
    VXLAT[2][0] = 0;
    VXLAT[2][1] = 0;
    bVar3 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    VXLAT[2]._0_8_ = this->period_;
    VXLAT[0][0] = 0;
    VXLAT[0][1] = -0x40100000;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = 0;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = 0;
    bVar4 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    VXLAT[0][0] = 0;
    VXLAT[0][1] = 0;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = 0x3ff00000;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = 0;
    VXLAT[2][0] = 0;
    VXLAT[2][1] = 0;
    bVar5 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    VXLAT[2]._0_8_ = this->period_;
    VXLAT[0][0] = 0;
    VXLAT[0][1] = 0;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = -0x40100000;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = 0;
    bVar6 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    VXLAT[0][0] = 0;
    VXLAT[0][1] = 0;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = 0;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = 0x3ff00000;
    VXLAT[2][0] = 0;
    VXLAT[2][1] = 0;
    bVar7 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    VXLAT[2]._0_8_ = this->period_;
    VXLAT[0][0] = 0;
    VXLAT[0][1] = 0;
    VXLAT[0][2] = 0;
    VXLAT[1][0] = 0;
    VXLAT[1][1] = 0;
    VXLAT[1][2] = -0x40100000;
    bVar8 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)VXLAT);
    puVar14 = (uint *)(Periodic::reorder_instances +
                      (ulong)((uint)bVar5 * 3 + (uint)bVar7 + (uint)bVar3 * 9 + 0xd) * 4);
    for (iVar21 = -(uint)bVar3; puVar15 = puVar14, iVar17 = -(uint)bVar5, iVar21 <= (int)(uint)bVar4
        ; iVar21 = iVar21 + 1) {
      for (; puVar16 = puVar15, lVar12 = -(ulong)bVar7, iVar17 <= (int)(uint)bVar6;
          iVar17 = iVar17 + 1) {
        for (; lVar12 <= (long)(ulong)bVar8; lVar12 = lVar12 + 1) {
          use_instance[*puVar16] = true;
          puVar16 = puVar16 + -1;
        }
        puVar15 = puVar15 + -3;
      }
      puVar14 = puVar14 + -9;
    }
  }
  else {
    for (; (ushort)uVar13 != 0x3fff;
        uVar13 = (ulong)(C->t_).
                        super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                        .
                        super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar13 & 0xffff].flags) {
      paiVar20 = VXLAT;
      bVar3 = false;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        iVar9 = VBW::ConvexCell::triangle_v_local_index(C,(ushort)uVar13,(index_t)lVar12);
        uVar10 = iVar9 - uVar1;
        if (iVar9 < uVar1) {
          *(int *)((long)paiVar20 + 0) = 0;
          *(int *)((long)paiVar20 + 4) = 0;
          iVar21 = 0;
        }
        else {
          *(undefined8 *)*paiVar20 =
               *(undefined8 *)get_periodic_vertex_instances_to_create::T[uVar10];
          iVar21 = get_periodic_vertex_instances_to_create::T[uVar10][2];
          bVar3 = true;
        }
        (*paiVar20)[2] = iVar21;
        paiVar20 = paiVar20 + 1;
      }
      if (bVar3) {
        *cell_is_on_boundary = true;
        iVar21 = 0xd;
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          iVar17 = iVar21;
          for (lVar18 = 0; lVar19 = 2, iVar22 = iVar17, lVar18 != 2; lVar18 = lVar18 + 1) {
            while (lVar19 != 0) {
              use_instance[*(uint *)(Periodic::reorder_instances + (long)iVar22 * 4)] = true;
              lVar19 = lVar19 + -1;
              iVar22 = iVar22 + VXLAT[2][1] * 3 + VXLAT[2][0] * 9 + VXLAT[2][2];
            }
            iVar17 = iVar17 + VXLAT[1][1] * 3 + VXLAT[1][0] * 9 + VXLAT[1][2];
          }
          iVar21 = iVar21 + VXLAT[0][1] * 3 + VXLAT[0][0] * 9 + VXLAT[0][2];
        }
      }
    }
  }
  iVar11 = 0;
  for (lVar12 = 1; lVar12 != 0x1b; lVar12 = lVar12 + 1) {
    iVar11 = iVar11 + use_instance[lVar12];
  }
  return iVar11;
}

Assistant:

index_t PeriodicDelaunay3d::get_periodic_vertex_instances_to_create(
	index_t v,
	ConvexCell& C,
	bool use_instance[27],
	bool& cell_is_on_boundary,
	bool& cell_is_outside_cube,
	IncidentTetrahedra& W
    ) {	
	// Integer translations associated with the six plane equations
	// Note: indexing matches code below (order of the clipping
	// operations).
	static int T[6][3]= {
	    { 1, 0, 0},
	    {-1, 0, 0},
	    { 0, 1, 0},
	    { 0,-1, 0},
	    { 0, 0, 1},
	    { 0, 0,-1}
	};

	copy_Laguerre_cell_from_Delaunay(v, C, W);
	geo_assert(!C.empty());
	    
	// Determine the periodic instances of the vertex to be created
	// ************************************************************
	//   - Find all the intersected boundary faces
	//   - The instances to create correspond to all the possible
	//     sums of translation vectors associated with the
	//     intersected boundary faces
	
	FOR(i,27) {
	    use_instance[i] = false;
	}
	use_instance[0] = true;

	index_t cube_offset = C.nb_v();
	C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  0.0));
	C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  period_));
	C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  0.0));
	C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  period_));	
	C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  0.0));
	C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  period_));

	cell_is_outside_cube = false;
	cell_is_on_boundary = false;
	
	if(C.empty()) {
	    // Special case: cell is completely outside the cube.	    
	    cell_is_outside_cube = true;
	    copy_Laguerre_cell_from_Delaunay(v, C, W);
	    // Clip the cell with the 3x3x3 (rubic's) cube that
	    // surrounds the cube. Not only this avoids generating
	    // some unnecessary virtual vertices, but also, without
	    // it, it would generate neighborhoods with virtual vertices
	    // coordinates that differ by more than twice the period.
	    C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  period_));
	    C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  2.0*period_));
	    C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  period_));
	    C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  2.0*period_));	
	    C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  period_));
	    C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  2.0*period_));

	    // Normally we cannot have an empty cell, empty cells were
	    // detected before.
	    geo_assert(!C.empty());
	    
	    // Now detect the bounds of the sub-(rubic's) cube overlapped
	    // by the cell.
	    int TXmin = 0, TXmax = 0,
		TYmin = 0, TYmax = 0,
		TZmin = 0, TZmax = 0;
	    if(C.cell_has_conflict(vec4( 1.0, 0.0, 0.0,  0.0))) {
		TXmin = -1;
	    }
	    if(C.cell_has_conflict(vec4(-1.0, 0.0, 0.0,  period_))) {
		TXmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 1.0, 0.0,  0.0))) {
		TYmin = -1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0,-1.0, 0.0,  period_))) {
		TYmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 0.0, 1.0,  0.0))) {
		TZmin = -1;
	    } 
	    if(C.cell_has_conflict(vec4( 0.0, 0.0,-1.0,  period_))) {
		TZmax = 1;
	    } 
	    for(int TX = TXmin; TX <= TXmax; ++TX) {
		for(int TY = TYmin; TY <= TYmax; ++TY) {
		    for(int TZ = TZmin; TZ <= TZmax; ++TZ) {
			use_instance[T_to_instance(-TX,-TY,-TZ)] = true;
		    }
		}
	    }
	} else {
	    // Back to the normal case, C contains the Laguerre cell clipped
	    // by the cube.
	    //   - Find all the intersected boundary faces
	    //   - The instances to create correspond to all the possible
	    //     sums of translation vectors associated with the
	    //     intersected boundary faces
	    
	    // Traverse all the Voronoi vertices of the face
	    for(
		VBW::ushort t = C.first_triangle();
		t!=VBW::END_OF_LIST; t=C.next_triangle(t)
	    ) {
		// The three (integer) translations associated with the
		// three faces on which the Voronoi vertex resides.
		int VXLAT[3][3];
		bool vertex_on_boundary = false;
		for(index_t lv=0; lv<3; ++lv) {
		    index_t pp = C.triangle_v_local_index(t,VBW::index_t(lv));
		    if(pp < cube_offset) {
			// Not a boundary face -> translation is zero.
			VXLAT[lv][0] = 0;
			VXLAT[lv][1] = 0;
			VXLAT[lv][2] = 0;
		    } else {
			// Boundary face -> there is a translation
			VXLAT[lv][0] = T[pp - cube_offset][0];
			VXLAT[lv][1] = T[pp - cube_offset][1];
			VXLAT[lv][2] = T[pp - cube_offset][2];
			vertex_on_boundary = true;
		    }
		}
		// If the vertex is on the boundary, mark all the instances
		// obtained by applying any combination of the (up to 3)
		// translations associated with the (up to 3)
		// boundary facets on which the vertex resides.
		if(vertex_on_boundary) {
		    cell_is_on_boundary = true;
		    for(int dU=0; dU<2; ++dU) {
			for(int dV=0; dV<2; ++dV) {
			    for(int dW=0; dW<2; ++dW) {
				
				int Tx = dU*VXLAT[0][0] + dV*VXLAT[1][0] +
				    dW*VXLAT[2][0];
				
				int Ty = dU*VXLAT[0][1] + dV*VXLAT[1][1] +
				    dW*VXLAT[2][1];
				
				int Tz = dU*VXLAT[0][2] + dV*VXLAT[1][2] +
				    dW*VXLAT[2][2];
				
				use_instance[T_to_instance(Tx,Ty,Tz)] = true;
			    }
			}
		    }
		}
	    }
	}
	index_t result = 0;
	for(index_t i=1; i<27; ++i) {
	    result += (use_instance[i] ? 1 : 0);
	}
	return result;
    }